

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_read_record_layer(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  uchar *puVar2;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var3;
  void *pvVar4;
  uchar *puVar5;
  mbedtls_cipher_info_t *pmVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uchar uVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  size_t *psVar16;
  mbedtls_ssl_config *pmVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uchar *puVar21;
  mbedtls_cipher_mode_t mVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  mbedtls_ssl_transform *pmVar26;
  ulong uVar27;
  mbedtls_md_context_t *ctx;
  char cVar28;
  ulong uVar29;
  ulong uVar30;
  char cVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  size_t olen_1;
  int major_ver;
  undefined2 local_70;
  uchar local_6e;
  ushort local_6d;
  uchar *p;
  undefined1 local_60;
  char local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  
  uVar20 = ssl->in_hslen;
  if (uVar20 == 0) {
    if (ssl->in_offt != (uchar *)0x0) {
      return 0;
    }
    psVar16 = &ssl->in_msglen;
LAB_001152e8:
    *psVar16 = 0;
  }
  else {
    if (ssl->in_offt != (uchar *)0x0) {
      return -0x6c00;
    }
    sVar23 = ssl->in_msglen - uVar20;
    if (ssl->in_msglen < uVar20 || sVar23 == 0) {
      psVar16 = &ssl->in_hslen;
      ssl->in_msglen = 0;
      goto LAB_001152e8;
    }
    ssl->in_msglen = sVar23;
    memmove(ssl->in_msg,ssl->in_msg + uVar20,sVar23);
    ssl->in_hslen = 0;
    if (ssl->in_msglen != 0) {
      return 0;
    }
  }
  iVar12 = mbedtls_ssl_fetch_input(ssl,(ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
  if (iVar12 != 0) {
    return iVar12;
  }
  pmVar17 = ssl->conf;
  bVar1 = *ssl->in_hdr;
  ssl->in_msgtype = (uint)bVar1;
  puVar21 = (uchar *)(ulong)(ushort)(*(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8);
  ssl->in_msglen = (size_t)puVar21;
  uVar14 = *(uint *)&pmVar17->field_0x174;
  mbedtls_ssl_read_version(&major_ver,(int *)&olen_1,uVar14 >> 1 & 1,ssl->in_hdr + 1);
  if ((bVar1 & 0xfffffffc) != 0x14) {
    iVar12 = -0x7200;
    if ((uVar14 & 2) == 0) {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
    }
    goto LAB_001153c5;
  }
  if (((major_ver != ssl->major_ver) || ((int)(uint)pmVar17->max_minor_ver < (int)olen_1)) ||
     (puVar2 = ssl->in_buf, puVar2 + (0x414d - (long)ssl->in_msg) < puVar21)) {
LAB_001153a5:
    iVar12 = -0x7200;
    goto LAB_001153c5;
  }
  if ((uVar14 & 2) == 0) goto LAB_0011540c;
  uVar11 = *(ushort *)ssl->in_ctr << 8 | *(ushort *)ssl->in_ctr >> 8;
  if (uVar11 == ssl->in_epoch) {
    iVar13 = mbedtls_ssl_dtls_replay_check(ssl);
    iVar12 = -0x6700;
    if (iVar13 == 0) {
      if (bVar1 == 0x17) {
        if ((ssl->state == 0x10) || ((ssl->state == 2 && (ssl->renego_status == 1))))
        goto LAB_0011540c;
      }
      else if ((bVar1 != 0x14) || ((ssl->state == 10 || (ssl->state == 0xc)))) {
LAB_0011540c:
        if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
          iVar12 = -0x7200;
          if (puVar21 + -0x4001 < (uchar *)0xffffffffffffc000) goto LAB_001153c5;
        }
        else {
          puVar2 = (uchar *)ssl->transform_in->minlen;
          if (puVar21 < puVar2) goto LAB_001153a5;
          if ((puVar2 + 0x4100 < puVar21) && (iVar12 = -0x7200, 0 < ssl->minor_ver))
          goto LAB_001153c5;
        }
        iVar12 = mbedtls_ssl_fetch_input(ssl,(size_t)(puVar21 + (ulong)(uVar14 & 2) * 4 + 5));
        if (iVar12 != 0) {
          return iVar12;
        }
        pmVar17 = ssl->conf;
        if ((pmVar17->field_0x174 & 2) == 0) {
          lVar25 = 0xe8;
          lVar19 = 0;
        }
        else {
          lVar19 = ssl->in_msglen + 0xd;
          lVar25 = 0xf8;
        }
        *(long *)((long)&ssl->conf + lVar25) = lVar19;
        pmVar26 = ssl->transform_in;
        if (pmVar26 == (mbedtls_ssl_transform *)0x0) goto LAB_00115c69;
        uVar18 = 0xffff9400;
        uVar14 = uVar18;
        if (ssl->session_in == (mbedtls_ssl_session *)0x0) goto switchD_001157cf_caseD_3;
        pmVar6 = (pmVar26->cipher_ctx_dec).cipher_info;
        if (pmVar6 == (mbedtls_cipher_info_t *)0x0) {
          mVar22 = MBEDTLS_MODE_NONE;
        }
        else {
          mVar22 = pmVar6->mode;
        }
        uVar20 = ssl->in_msglen;
        if (uVar20 < pmVar26->minlen) {
LAB_00115726:
          uVar14 = 0xffff8e80;
        }
        else {
          switch(mVar22) {
          case MBEDTLS_MODE_CBC:
            olen_1 = 0;
            sVar24 = pmVar26->ivlen;
            sVar35 = 0;
            if (1 < ssl->minor_ver) {
              sVar35 = sVar24;
            }
            uVar14 = 0xffff8e80;
            if ((sVar35 + sVar24 <= uVar20) && (sVar35 + pmVar26->maclen + 1 <= uVar20)) {
              puVar21 = ssl->in_msg;
              iVar12 = ssl->session_in->encrypt_then_mac;
              uVar27 = uVar20;
              if (iVar12 == 1) {
                uVar27 = uVar20 - pmVar26->maclen;
                ssl->in_msglen = uVar27;
                _major_ver = *(size_t *)ssl->in_ctr;
                local_6e = ssl->in_hdr[2];
                local_70 = *(undefined2 *)ssl->in_hdr;
                local_6d = (ushort)uVar27 << 8 | (ushort)uVar27 >> 8;
                mbedtls_md_hmac_update(&pmVar26->md_ctx_dec,(uchar *)&major_ver,0xd);
                mbedtls_md_hmac_update(&ssl->transform_in->md_ctx_dec,ssl->in_iv,ssl->in_msglen);
                mbedtls_md_hmac_finish(&ssl->transform_in->md_ctx_dec,(uchar *)&p);
                mbedtls_md_hmac_reset(&ssl->transform_in->md_ctx_dec);
                iVar13 = mbedtls_ssl_safer_memcmp
                                   (ssl->in_iv + ssl->in_msglen,&p,ssl->transform_in->maclen);
                if (iVar13 != 0) break;
                pmVar26 = ssl->transform_in;
                uVar20 = ssl->in_msglen;
                sVar24 = pmVar26->ivlen;
              }
              if (uVar20 % sVar24 == 0) {
                if (1 < ssl->minor_ver) {
                  ssl->in_msglen = uVar20 - sVar24;
                  uVar20 = sVar24;
                  for (uVar29 = 0; uVar29 < uVar20; uVar29 = uVar29 + 1) {
                    pmVar26->iv_dec[uVar29] = ssl->in_iv[uVar29];
                    pmVar26 = ssl->transform_in;
                    uVar20 = pmVar26->ivlen;
                  }
                  uVar27 = uVar27 - sVar24;
                  sVar24 = uVar20;
                }
                uVar14 = mbedtls_cipher_crypt
                                   (&pmVar26->cipher_ctx_dec,pmVar26->iv_dec,sVar24,puVar21,uVar27,
                                    puVar21,&olen_1);
                if ((uVar14 == 0) && (uVar14 = 0xffff9400, uVar27 == olen_1)) {
                  bVar39 = true;
                  if (ssl->minor_ver < 2) {
                    pmVar26 = ssl->transform_in;
                    memcpy(pmVar26->iv_dec,(pmVar26->cipher_ctx_dec).iv,pmVar26->ivlen);
                    bVar39 = 0 < ssl->minor_ver;
                  }
                  bVar40 = iVar12 == 1;
                  uVar20 = ssl->in_msglen;
                  uVar29 = (ulong)ssl->in_msg[uVar20 - 1];
                  sVar24 = ssl->transform_in->maclen;
                  bVar37 = sVar24 + uVar29 + 1 <= uVar20;
                  uVar27 = 0;
                  if (bVar37 || bVar40) {
                    uVar27 = uVar29 + 1;
                  }
                  if (bVar39) {
                    bVar39 = uVar27 < uVar20;
                    bVar38 = ~uVar27 + uVar20 < sVar24 + 0x4000;
                    uVar29 = ~uVar27 + uVar20;
                    if ((!bVar39 || !bVar37 && !bVar40) || !bVar38) {
                      uVar29 = 0;
                    }
                    uVar32 = 0;
                    uVar30 = 1;
                    uVar34 = uVar30;
                    for (; uVar30 != 0x101; uVar30 = uVar30 + 1) {
                      if (uVar27 < uVar30) {
                        uVar34 = 0;
                      }
                      uVar36 = 0;
                      if (uVar27 - 1 == (ulong)ssl->in_msg[uVar30 + uVar29]) {
                        uVar36 = uVar34;
                      }
                      uVar32 = uVar32 + uVar36;
                    }
                    uVar15 = 0x1ff;
                    if (uVar32 != uVar27 || ((!bVar39 || !bVar37 && !bVar40) || !bVar38)) {
                      uVar15 = 0;
                    }
                    uVar15 = (uint)uVar27 & uVar15;
                    puVar21 = (uchar *)(uVar20 - uVar15);
                    ssl->in_msglen = (size_t)puVar21;
                    if (iVar12 != 1) {
                      uVar33 = (uint)(uVar32 == uVar27 && ((bVar39 && (bVar37 || bVar40)) && bVar38)
                                     );
                      goto LAB_00115a6e;
                    }
                    goto LAB_00115bda;
                  }
                }
              }
            }
            break;
          case MBEDTLS_MODE_GCM:
          case MBEDTLS_MODE_CCM:
            uVar27 = (ulong)((pmVar26->ciphersuite_info->flags & 2) == 0);
            sVar24 = pmVar26->fixed_ivlen;
            sVar23 = pmVar26->ivlen - sVar24;
            uVar29 = sVar23 + uVar27 * 8 + 8;
            sVar35 = uVar20 - uVar29;
            if (uVar29 <= uVar20) {
              puVar21 = ssl->in_msg;
              ssl->in_msglen = sVar35;
              p = *(uchar **)ssl->in_ctr;
              local_60 = (undefined1)ssl->in_msgtype;
              uVar14 = ssl->minor_ver;
              cVar28 = (char)ssl->major_ver;
              cVar31 = '\x01';
              if (uVar14 != 2) {
                cVar31 = (char)uVar14;
              }
              bVar39 = (pmVar17->field_0x174 & 2) == 0;
              local_5f = '\x01' - cVar28;
              if (bVar39) {
                local_5f = cVar28;
              }
              uVar33 = (uint)(byte)-cVar31;
              if (bVar39) {
                uVar33 = uVar14;
              }
              local_5e = (undefined1)uVar33;
              local_5d = (undefined1)(sVar35 >> 8);
              local_5c = (undefined1)sVar35;
              memcpy(pmVar26->iv_dec + sVar24,ssl->in_iv,sVar23);
              pmVar26 = ssl->transform_in;
              uVar14 = mbedtls_cipher_auth_decrypt
                                 (&pmVar26->cipher_ctx_dec,pmVar26->iv_dec,pmVar26->ivlen,
                                  (uchar *)&p,0xd,puVar21,sVar35,puVar21,(size_t *)&major_ver,
                                  puVar21 + sVar35,uVar27 * 8 + 8);
              if (uVar14 != 0xffff9d00) {
                if ((uVar14 != 0) || (uVar14 = uVar18, _major_ver != sVar35)) break;
LAB_00115bd3:
                puVar21 = (uchar *)ssl->in_msglen;
LAB_00115bda:
                if (puVar21 == (uchar *)0x0) {
                  iVar12 = ssl->nb_zero;
                  ssl->nb_zero = iVar12 + 1;
                  uVar14 = 0xffff8e80;
                  if (2 < iVar12) break;
                }
                else {
                  ssl->nb_zero = 0;
                }
                pmVar17 = ssl->conf;
                uVar14 = *(uint *)&pmVar17->field_0x174;
                if ((uVar14 & 2) == 0) {
                  uVar20 = 8;
                  while (uVar27 = (ulong)(uVar14 & 2), uVar27 < uVar20) {
                    puVar21 = ssl->in_ctr + (uVar20 - 1);
                    *puVar21 = *puVar21 + '\x01';
                    pmVar17 = ssl->conf;
                    if (*puVar21 != '\0') {
                      uVar27 = (ulong)(*(uint *)&pmVar17->field_0x174 & 2);
                      break;
                    }
                    uVar20 = uVar20 - 1;
                    uVar14 = *(uint *)&pmVar17->field_0x174;
                  }
                  uVar14 = 0xffff9480;
                  if (uVar27 == uVar20) break;
                  puVar21 = (uchar *)ssl->in_msglen;
                }
                uVar14 = 0xffff8e00;
                if (puVar21 < (uchar *)0x4001) {
LAB_00115c69:
                  if ((pmVar17->field_0x174 & 2) != 0) {
                    mbedtls_ssl_dtls_replay_update(ssl);
                    return 0;
                  }
                  return 0;
                }
                break;
              }
            }
            goto LAB_00115726;
          case MBEDTLS_MODE_STREAM:
            p = (uchar *)0x0;
            uVar14 = mbedtls_cipher_crypt
                               (&pmVar26->cipher_ctx_dec,pmVar26->iv_dec,pmVar26->ivlen,ssl->in_msg,
                                uVar20,ssl->in_msg,(size_t *)&p);
            if ((uVar14 == 0) && (puVar21 = (uchar *)ssl->in_msglen, uVar14 = uVar18, puVar21 == p))
            {
              uVar33 = 1;
              sVar24 = ssl->transform_in->maclen;
              uVar15 = 0;
LAB_00115a6e:
              ssl->in_msglen = (long)puVar21 - sVar24;
              *ssl->in_len = (uchar)((long)puVar21 - sVar24 >> 8);
              ssl->in_len[1] = (uchar)ssl->in_msglen;
              uVar14 = uVar18;
              if (0 < ssl->minor_ver) {
                iVar12 = (int)ssl->in_msglen;
                mbedtls_md_hmac_update(&ssl->transform_in->md_ctx_dec,ssl->in_ctr,8);
                mbedtls_md_hmac_update(&ssl->transform_in->md_ctx_dec,ssl->in_hdr,3);
                mbedtls_md_hmac_update(&ssl->transform_in->md_ctx_dec,ssl->in_len,2);
                mbedtls_md_hmac_update(&ssl->transform_in->md_ctx_dec,ssl->in_msg,ssl->in_msglen);
                mbedtls_md_hmac_finish(&ssl->transform_in->md_ctx_dec,(uchar *)&p);
                lVar19 = (ulong)(uVar33 * 0xff &
                                (uVar15 + iVar12 + 0x15 >> 6) - (iVar12 + 0x15U >> 6)) + 1;
                while( true ) {
                  ctx = &ssl->transform_in->md_ctx_dec;
                  bVar39 = lVar19 == 0;
                  lVar19 = lVar19 + -1;
                  if (bVar39) break;
                  mbedtls_md_process(ctx,ssl->in_msg);
                }
                mbedtls_md_hmac_reset(ctx);
                iVar12 = mbedtls_ssl_safer_memcmp
                                   (ssl->in_msg + ssl->in_msglen,&p,ssl->transform_in->maclen);
                if ((iVar12 == 0) && (uVar33 != 0)) goto LAB_00115bd3;
                goto LAB_00115726;
              }
            }
          }
        }
switchD_001157cf_caseD_3:
        if ((ssl->conf->field_0x174 & 2) == 0) {
LAB_00115737:
          if (uVar14 == 0xffff8e80) {
            mbedtls_ssl_send_alert_message(ssl,'\x02','\x14');
            return -0x7180;
          }
          return uVar14;
        }
        if ((uVar14 | 0x80) != 0xffff8e80) {
          return uVar14;
        }
        if ((ssl->state == 0xd) || (ssl->state == 0xb)) goto LAB_00115737;
        uVar14 = ssl->conf->badmac_limit;
        if ((uVar14 != 0) &&
           (uVar18 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar18, uVar14 <= uVar18)) {
          return -0x7180;
        }
        goto LAB_0011578c;
      }
    }
  }
  else {
    iVar12 = -0x6700;
    if (((((uVar14 & 1) != 0) && (bVar1 == 0x16)) &&
        ((uVar11 == 0 && ((ssl->state == 0x10 && (uVar20 = ssl->in_left, 0xd < uVar20)))))) &&
       (puVar2[0xd] == '\x01')) {
      p_Var3 = pmVar17->f_cookie_write;
      iVar12 = -0x7100;
      if ((((((pmVar17->f_cookie_check !=
               (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0 &&
               p_Var3 != (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) &&
             (iVar12 = -0x7900, 0x3c < uVar20)) && (*puVar2 == '\x16')) &&
           ((puVar2[3] == '\0' && (puVar2[4] == '\0')))) &&
          ((puVar2[0x13] == '\0' && ((puVar2[0x14] == '\0' && (puVar2[0x15] == '\0')))))) &&
         ((uVar27 = (ulong)puVar2[0x3b], uVar27 <= uVar20 - 0x3d &&
          ((ulong)puVar2[uVar27 + 0x3c] <= uVar20 - 0x3c)))) {
        pvVar4 = pmVar17->p_cookie;
        puVar21 = ssl->out_buf;
        puVar5 = ssl->cli_id;
        sVar24 = ssl->cli_id_len;
        iVar12 = (*pmVar17->f_cookie_check)
                           (pvVar4,puVar2 + uVar27 + 0x3d,(ulong)puVar2[uVar27 + 0x3c],puVar5,sVar24
                           );
        if (iVar12 == 0) {
          iVar13 = ssl_session_reset_int(ssl,1);
          iVar12 = -0x6780;
          if (iVar13 != 0) {
            iVar12 = iVar13;
          }
        }
        else {
          uVar7 = *(undefined8 *)puVar2;
          uVar8 = *(undefined8 *)(puVar2 + 8);
          uVar9 = *(undefined8 *)(puVar2 + 0x11);
          *(undefined8 *)(puVar21 + 9) = *(undefined8 *)(puVar2 + 9);
          *(undefined8 *)(puVar21 + 0x11) = uVar9;
          *(undefined8 *)puVar21 = uVar7;
          *(undefined8 *)(puVar21 + 8) = uVar8;
          puVar21[0xd] = '\x03';
          puVar21[0x19] = 0xfe;
          puVar21[0x1a] = 0xff;
          p = puVar21 + 0x1c;
          iVar13 = (*p_Var3)(pvVar4,&p,puVar21 + 0x4000,puVar5,sVar24);
          iVar12 = -0x6c00;
          if (iVar13 == 0) {
            sVar24 = (long)p - (long)puVar21;
            cVar31 = (char)sVar24;
            puVar21[0x1b] = cVar31 + 0xe4;
            iVar12 = (int)sVar24;
            uVar10 = (uchar)((uint)(iVar12 + 0xffffe7) >> 0x10);
            puVar21[0x16] = uVar10;
            puVar21[0xe] = uVar10;
            uVar10 = (uchar)((uint)(iVar12 + 0xffe7) >> 8);
            puVar21[0x17] = uVar10;
            puVar21[0xf] = uVar10;
            puVar21[0x18] = cVar31 + 0xe7;
            puVar21[0x10] = cVar31 + 0xe7;
            puVar21[0xb] = (uchar)((uint)(iVar12 + 0xfff3) >> 8);
            puVar21[0xc] = cVar31 + 0xf3;
            (*ssl->f_send)(ssl->p_bio,ssl->out_buf,sVar24);
            iVar12 = -0x6a80;
          }
        }
      }
    }
  }
LAB_001153c5:
  if (iVar12 == -0x6780) {
    return -0x6780;
  }
  if ((*(uint *)&ssl->conf->field_0x174 & 2) == 0) {
    return iVar12;
  }
  if (iVar12 == -0x6700) {
    ssl->next_record_offset = ssl->in_msglen + 0xd;
    return -0x6580;
  }
LAB_0011578c:
  ssl->next_record_offset = 0;
  ssl->in_left = 0;
  return -0x6580;
}

Assistant:

int mbedtls_ssl_read_record_layer( mbedtls_ssl_context *ssl )
{
    int ret;

    /*
     * Step A
     *
     * Consume last content-layer message and potentially
     * update in_msglen which keeps track of the contents'
     * consumption state.
     *
     * (1) Handshake messages:
     *     Remove last handshake message, move content
     *     and adapt in_msglen.
     *
     * (2) Alert messages:
     *     Consume whole record content, in_msglen = 0.
     *
     * (3) Change cipher spec:
     *     Consume whole record content, in_msglen = 0.
     *
     * (4) Application data:
     *     Don't do anything - the record layer provides
     *     the application data as a stream transport
     *     and consumes through mbedtls_ssl_read only.
     *
     */

    /* Case (1): Handshake messages */
    if( ssl->in_hslen != 0 )
    {
        /* Hard assertion to be sure that no application data
         * is in flight, as corrupting ssl->in_msglen during
         * ssl->in_offt != NULL is fatal. */
        if( ssl->in_offt != NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Get next Handshake message in the current record
         */

        /* Notes:
         * (1) in_hslen is not necessarily the size of the
         *     current handshake content: If DTLS handshake
         *     fragmentation is used, that's the fragment
         *     size instead. Using the total handshake message
         *     size here is faulty and should be changed at
         *     some point.
         * (2) While it doesn't seem to cause problems, one
         *     has to be very careful not to assume that in_hslen
         *     is always <= in_msglen in a sensible communication.
         *     Again, it's wrong for DTLS handshake fragmentation.
         *     The following check is therefore mandatory, and
         *     should not be treated as a silently corrected assertion.
         *     Additionally, ssl->in_hslen might be arbitrarily out of
         *     bounds after handling a DTLS message with an unexpected
         *     sequence number, see mbedtls_ssl_prepare_handshake_record.
         */
        if( ssl->in_hslen < ssl->in_msglen )
        {
            ssl->in_msglen -= ssl->in_hslen;
            memmove( ssl->in_msg, ssl->in_msg + ssl->in_hslen,
                     ssl->in_msglen );

            MBEDTLS_SSL_DEBUG_BUF( 4, "remaining content in record",
                                   ssl->in_msg, ssl->in_msglen );
        }
        else
        {
            ssl->in_msglen = 0;
        }

        ssl->in_hslen   = 0;
    }
    /* Case (4): Application data */
    else if( ssl->in_offt != NULL )
    {
        return( 0 );
    }
    /* Everything else (CCS & Alerts) */
    else
    {
        ssl->in_msglen = 0;
    }

    /*
     * Step B
     *
     * Fetch and decode new record if current one is fully consumed.
     *
     */

    if( ssl->in_msglen > 0 )
    {
        /* There's something left to be processed in the current record. */
        return( 0 );
    }

    /* Current record either fully processed or to be discarded. */

    if( ( ret = mbedtls_ssl_fetch_input( ssl, mbedtls_ssl_hdr_len( ssl ) ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    if( ( ret = ssl_parse_record_header( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
            ret != MBEDTLS_ERR_SSL_CLIENT_RECONNECT )
        {
            if( ret == MBEDTLS_ERR_SSL_UNEXPECTED_RECORD )
            {
                /* Skip unexpected record (but not whole datagram) */
                ssl->next_record_offset = ssl->in_msglen
                                        + mbedtls_ssl_hdr_len( ssl );

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding unexpected record "
                                            "(header)" ) );
            }
            else
            {
                /* Skip invalid record and the rest of the datagram */
                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record "
                                            "(header)" ) );
            }

            /* Get next record */
            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
#endif
        return( ret );
    }

    /*
     * Read and optionally decrypt the message contents
     */
    if( ( ret = mbedtls_ssl_fetch_input( ssl,
                                 mbedtls_ssl_hdr_len( ssl ) + ssl->in_msglen ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    /* Done reading this record, get ready for the next one */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->next_record_offset = ssl->in_msglen + mbedtls_ssl_hdr_len( ssl );
        if( ssl->next_record_offset < ssl->in_left )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "more than one record within datagram" ) );
        }
    }
    else
#endif
        ssl->in_left = 0;

    if( ( ret = ssl_prepare_record_content( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Silently discard invalid records */
            if( ret == MBEDTLS_ERR_SSL_INVALID_RECORD ||
                ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                /* Except when waiting for Finished as a bad mac here
                 * probably means something went wrong in the handshake
                 * (eg wrong psk used, mitm downgrade attempt, etc.) */
                if( ssl->state == MBEDTLS_SSL_CLIENT_FINISHED ||
                    ssl->state == MBEDTLS_SSL_SERVER_FINISHED )
                {
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
                    if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
                    {
                        mbedtls_ssl_send_alert_message( ssl,
                                MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
                    }
#endif
                    return( ret );
                }

#if defined(MBEDTLS_SSL_DTLS_BADMAC_LIMIT)
                if( ssl->conf->badmac_limit != 0 &&
                    ++ssl->badmac_seen >= ssl->conf->badmac_limit )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "too many records with bad MAC" ) );
                    return( MBEDTLS_ERR_SSL_INVALID_MAC );
                }
#endif

                /* As above, invalid records cause
                 * dismissal of the whole datagram. */

                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record (mac)" ) );
                return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
            }

            return( ret );
        }
        else
#endif
        {
            /* Error out (and send alert) on invalid records */
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
            if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                        MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
            }
#endif
            return( ret );
        }
    }

    return( 0 );
}